

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ConstantExpressionRunner<wasm::CExpressionRunner>::visitGlobalSet
          (Flow *__return_storage_ptr__,ConstantExpressionRunner<wasm::CExpressionRunner> *this,
          GlobalSet *curr)

{
  Name breakTo;
  bool bVar1;
  Global *pGVar2;
  undefined1 local_78 [8];
  Flow setFlow;
  GlobalSet *curr_local;
  ConstantExpressionRunner<wasm::CExpressionRunner> *this_local;
  
  if (((*(uint *)&(this->super_ExpressionRunner<wasm::CExpressionRunner>).field_0x1c & 1) == 0) &&
     ((this->super_ExpressionRunner<wasm::CExpressionRunner>).module != (Module *)0x0)) {
    setFlow.breakTo.super_IString.str._M_str = (char *)(curr->name).super_IString.str._M_len;
    pGVar2 = Module::getGlobal((this->super_ExpressionRunner<wasm::CExpressionRunner>).module,
                               (Name)(curr->name).super_IString.str);
    if ((pGVar2->mutable_ & 1U) == 0) {
      __assert_fail("this->module->getGlobal(curr->name)->mutable_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                    ,0x849,
                    "Flow wasm::ConstantExpressionRunner<wasm::CExpressionRunner>::visitGlobalSet(GlobalSet *) [SubType = wasm::CExpressionRunner]"
                   );
    }
    ExpressionRunner<wasm::CExpressionRunner>::visit
              ((Flow *)local_78,&this->super_ExpressionRunner<wasm::CExpressionRunner>,curr->value);
    bVar1 = Flow::breaking((Flow *)local_78);
    if (!bVar1) {
      setGlobalValue(this,(Name)(curr->name).super_IString.str,(Literals *)local_78);
      Flow::Flow(__return_storage_ptr__);
    }
    Flow::~Flow((Flow *)local_78);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
  }
  breakTo.super_IString.str._M_str = DAT_027e5710;
  breakTo.super_IString.str._M_len = NONCONSTANT_FLOW;
  Flow::Flow(__return_storage_ptr__,breakTo);
  return __return_storage_ptr__;
}

Assistant:

Flow visitGlobalSet(GlobalSet* curr) {
    NOTE_ENTER("GlobalSet");
    NOTE_NAME(curr->name);
    if (!(flags & FlagValues::PRESERVE_SIDEEFFECTS) &&
        this->module != nullptr) {
      // If we are evaluating and not replacing the expression, remember the
      // constant value set, if any, for subsequent gets.
      assert(this->module->getGlobal(curr->name)->mutable_);
      auto setFlow = ExpressionRunner<SubType>::visit(curr->value);
      if (!setFlow.breaking()) {
        setGlobalValue(curr->name, setFlow.values);
        return Flow();
      }
    }
    return Flow(NONCONSTANT_FLOW);
  }